

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::Inserter::
insertOne(Inserter *this,qsizetype pos,X509CertificateExtension *t)

{
  undefined8 *puVar1;
  X509CertificateExtension *pXVar2;
  qsizetype qVar3;
  X509CertificateExtension *pXVar4;
  undefined8 uVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  undefined8 uVar8;
  PrivateShared *pPVar9;
  bool bVar10;
  long lVar11;
  long lVar12;
  
  pXVar2 = this->begin;
  lVar11 = this->size;
  pXVar4 = pXVar2 + lVar11;
  this->end = pXVar4;
  this->last = pXVar2 + lVar11 + -1;
  this->where = pXVar2 + pos;
  lVar11 = lVar11 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar11;
  this->sourceCopyAssign = 1;
  if (lVar11 < 1) {
    this->sourceCopyConstruct = 1 - lVar11;
    this->move = 0;
    this->sourceCopyAssign = lVar11;
    pDVar6 = (t->oid).d.d;
    (t->oid).d.d = (Data *)0x0;
    (pXVar4->oid).d.d = pDVar6;
    pcVar7 = (t->oid).d.ptr;
    (t->oid).d.ptr = (char16_t *)0x0;
    (pXVar4->oid).d.ptr = pcVar7;
    qVar3 = (t->oid).d.size;
    (t->oid).d.size = 0;
    (pXVar4->oid).d.size = qVar3;
    pDVar6 = (t->name).d.d;
    (t->name).d.d = (Data *)0x0;
    (pXVar4->name).d.d = pDVar6;
    pcVar7 = (t->name).d.ptr;
    (t->name).d.ptr = (char16_t *)0x0;
    (pXVar4->name).d.ptr = pcVar7;
    qVar3 = (t->name).d.size;
    (t->name).d.size = 0;
    (pXVar4->name).d.size = qVar3;
    pPVar9 = (t->value).d.data.shared;
    uVar5 = *(undefined8 *)((long)&(t->value).d.data + 8);
    uVar8 = *(undefined8 *)&(t->value).d.field_0x18;
    *(undefined8 *)((long)&(pXVar4->value).d.data + 0x10) =
         *(undefined8 *)((long)&(t->value).d.data + 0x10);
    *(undefined8 *)&(pXVar4->value).d.field_0x18 = uVar8;
    (pXVar4->value).d.data.shared = pPVar9;
    *(undefined8 *)((long)&(pXVar4->value).d.data + 8) = uVar5;
    *(undefined8 *)((long)&(t->value).d.data + 0x10) = 0;
    (t->value).d.data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(t->value).d.data + 8) = 0;
    *(undefined8 *)&(t->value).d.field_0x18 = 2;
    bVar10 = t->supported;
    pXVar4->critical = t->critical;
    pXVar4->supported = bVar10;
    this->size = this->size + 1;
  }
  else {
    pDVar6 = pXVar4[-1].oid.d.d;
    pcVar7 = pXVar4[-1].oid.d.ptr;
    pXVar4[-1].oid.d.d = (Data *)0x0;
    pXVar4[-1].oid.d.ptr = (char16_t *)0x0;
    (pXVar4->oid).d.d = pDVar6;
    (pXVar4->oid).d.ptr = pcVar7;
    qVar3 = pXVar4[-1].oid.d.size;
    pXVar4[-1].oid.d.size = 0;
    (pXVar4->oid).d.size = qVar3;
    pDVar6 = pXVar4[-1].name.d.d;
    pcVar7 = pXVar4[-1].name.d.ptr;
    pXVar4[-1].name.d.d = (Data *)0x0;
    pXVar4[-1].name.d.ptr = (char16_t *)0x0;
    (pXVar4->name).d.d = pDVar6;
    (pXVar4->name).d.ptr = pcVar7;
    qVar3 = pXVar4[-1].name.d.size;
    pXVar4[-1].name.d.size = 0;
    (pXVar4->name).d.size = qVar3;
    uVar5 = *(undefined8 *)((long)&pXVar4[-1].value.d.data + 8);
    (pXVar4->value).d.data.shared = pXVar4[-1].value.d.data.shared;
    *(undefined8 *)((long)&(pXVar4->value).d.data + 8) = uVar5;
    uVar5 = *(undefined8 *)&pXVar4[-1].value.d.field_0x18;
    *(undefined8 *)((long)&(pXVar4->value).d.data + 0x10) =
         *(undefined8 *)((long)&pXVar4[-1].value.d.data + 0x10);
    *(undefined8 *)&(pXVar4->value).d.field_0x18 = uVar5;
    pXVar4[-1].value.d.data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&pXVar4[-1].value.d.data + 8) = 0;
    *(undefined8 *)((long)&pXVar4[-1].value.d.data + 0x10) = 0;
    *(undefined8 *)&pXVar4[-1].value.d.field_0x18 = 2;
    bVar10 = pXVar4[-1].supported;
    pXVar4->critical = pXVar4[-1].critical;
    pXVar4->supported = bVar10;
    this->size = this->size + 1;
    if (this->move != 0) {
      lVar11 = 0;
      lVar12 = 0;
      do {
        pXVar4 = this->last;
        puVar1 = (undefined8 *)((long)&(pXVar4->oid).d.d + lVar11);
        uVar5 = *puVar1;
        uVar8 = puVar1[1];
        *puVar1 = puVar1[-0xb];
        puVar1[1] = puVar1[-10];
        puVar1[-0xb] = uVar5;
        puVar1[-10] = uVar8;
        uVar5 = puVar1[2];
        puVar1[2] = puVar1[-9];
        puVar1[-9] = uVar5;
        uVar5 = puVar1[3];
        uVar8 = puVar1[4];
        puVar1[3] = puVar1[-8];
        puVar1[4] = puVar1[-7];
        puVar1[-8] = uVar5;
        puVar1[-7] = uVar8;
        uVar5 = puVar1[5];
        puVar1[5] = puVar1[-6];
        puVar1[-6] = uVar5;
        QVariant::operator=((QVariant *)(puVar1 + 6),(QVariant *)((long)pXVar4 + lVar11 + -0x28));
        *(undefined2 *)(&pXVar4->critical + lVar11) = *(undefined2 *)((long)pXVar4 + lVar11 + -8);
        lVar12 = lVar12 + -1;
        lVar11 = lVar11 + -0x58;
      } while (lVar12 != this->move);
    }
    pXVar4 = this->where;
    pDVar6 = (pXVar4->oid).d.d;
    (pXVar4->oid).d.d = (t->oid).d.d;
    (t->oid).d.d = pDVar6;
    pcVar7 = (pXVar4->oid).d.ptr;
    (pXVar4->oid).d.ptr = (t->oid).d.ptr;
    (t->oid).d.ptr = pcVar7;
    qVar3 = (pXVar4->oid).d.size;
    (pXVar4->oid).d.size = (t->oid).d.size;
    (t->oid).d.size = qVar3;
    pDVar6 = (pXVar4->name).d.d;
    (pXVar4->name).d.d = (t->name).d.d;
    (t->name).d.d = pDVar6;
    pcVar7 = (pXVar4->name).d.ptr;
    (pXVar4->name).d.ptr = (t->name).d.ptr;
    (t->name).d.ptr = pcVar7;
    qVar3 = (pXVar4->name).d.size;
    (pXVar4->name).d.size = (t->name).d.size;
    (t->name).d.size = qVar3;
    QVariant::operator=(&pXVar4->value,&t->value);
    bVar10 = t->supported;
    pXVar4->critical = t->critical;
    pXVar4->supported = bVar10;
  }
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }